

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

void __thiscall LexicalAnalyzer::Parse(LexicalAnalyzer *this)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  char *pcVar7;
  int local_48;
  char peek;
  char ch;
  int j;
  undefined1 local_38 [8];
  string word;
  int i;
  LexicalAnalyzer *this_local;
  
  word.field_2._12_4_ = 0;
  do {
    uVar4 = (ulong)(int)word.field_2._12_4_;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->lines);
    if (sVar5 <= uVar4) {
      return;
    }
    std::__cxx11::string::string((string *)local_38);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->lines,(long)(int)word.field_2._12_4_);
    std::__cxx11::string::operator+=((string *)pvVar6,' ');
    local_48 = 0;
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->lines,(long)(int)word.field_2._12_4_);
      uVar4 = std::__cxx11::string::size();
      if (uVar4 <= (ulong)(long)local_48) break;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->lines,(long)(int)word.field_2._12_4_);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar6);
      cVar1 = *pcVar7;
      iVar3 = isdigit((int)cVar1);
      if ((((iVar3 == 0) && (iVar3 = isalpha((int)cVar1), iVar3 == 0)) && (cVar1 != '_')) &&
         (cVar1 != '.')) {
        if ((cVar1 == '-') || (cVar1 == '+')) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->lines,(long)(int)word.field_2._12_4_);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar6);
          if (*pcVar7 != 'e') {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&this->lines,(long)(int)word.field_2._12_4_);
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar6);
            if (*pcVar7 != 'E') {
              AddWord(this,(string *)local_38,word.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_38,cVar1);
              AddWord(this,(string *)local_38,word.field_2._12_4_);
              goto LAB_0010a266;
            }
          }
          std::__cxx11::string::operator+=((string *)local_38,cVar1);
        }
        else if (((cVar1 == '=') || (cVar1 == '<')) || ((cVar1 == '>' || (cVar1 == '!')))) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->lines,(long)(int)word.field_2._12_4_);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar6);
          cVar2 = *pcVar7;
          if ((((cVar1 == '=') && (cVar2 == '=')) || ((cVar1 == '<' && (cVar2 == '=')))) ||
             (((cVar1 == '>' && (cVar2 == '=')) || ((cVar1 == '!' && (cVar2 == '=')))))) {
            AddWord(this,(string *)local_38,word.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_38,cVar1);
            std::__cxx11::string::operator+=((string *)local_38,cVar2);
            AddWord(this,(string *)local_38,word.field_2._12_4_);
            local_48 = local_48 + 1;
          }
          else {
            AddWord(this,(string *)local_38,word.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_38,cVar1);
            AddWord(this,(string *)local_38,word.field_2._12_4_);
          }
        }
        else {
          AddWord(this,(string *)local_38,word.field_2._12_4_);
          if ((cVar1 != ' ') && (cVar1 != '\t')) {
            std::__cxx11::string::operator+=((string *)local_38,cVar1);
            AddWord(this,(string *)local_38,word.field_2._12_4_);
          }
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)local_38,cVar1);
      }
LAB_0010a266:
      local_48 = local_48 + 1;
    }
    std::__cxx11::string::~string((string *)local_38);
    word.field_2._12_4_ = word.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void LexicalAnalyzer::Parse() {
    for (int i = 0; i < lines.size(); i++) {
        std::string word;
        lines[i] += ' ';//temporary space
        for (int j = 0; j < lines[i].size(); j++) {
            char ch = lines[i][j];
            if (isdigit(ch) || isalpha(ch) || ch == '_' || ch == '.') {//digit,alpha,underline
                word += ch;
            } else if (ch == '-' || ch == '+') {
                //operator - or minus ?
                if (lines[i][j - 1] == 'e' || lines[i][j - 1] == 'E') {
                    word += ch;
                } else {
                    AddWord(word, i);
                    word += ch;
                    AddWord(word, i);
                }
            } else if (ch == '=' || ch == '<' || ch == '>' || ch == '!') {
                char peek = lines[i][j + 1];
                if ((ch == '=' && peek == '=') || (ch == '<' && peek == '=') || (ch == '>' && peek == '=') ||
                    (ch == '!' && peek == '=')) {
                    AddWord(word, i);
                    word += ch;
                    word += peek;
                    AddWord(word, i);
                    ++j;
                } else {
                    AddWord(word, i);
                    word += ch;
                    AddWord(word, i);
                }
            } else {//others
                AddWord(word, i);
                if (ch == ' ' || ch == '\t') continue;
                word += ch;
                AddWord(word, i);
            }
        }
    }
}